

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

Integer __thiscall nvim::Nvim::win_get_height(Nvim *this,Window window)

{
  Integer res;
  allocator local_49;
  Integer local_48;
  Window local_40;
  string local_38;
  
  local_40 = window;
  std::__cxx11::string::string((string *)&local_38,"nvim_win_get_height",&local_49);
  NvimRPC::call<long>(&this->client_,&local_38,&local_48,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return local_48;
}

Assistant:

Integer Nvim::win_get_height(Window window) {
    Integer res;
    client_.call("nvim_win_get_height", res, window);
    return res;
}